

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool GetXrParent(XrObjectType inhandle_type,uint64_t inhandle,XrObjectType *outhandle_type,
                uint64_t *outhandle)

{
  XrSession_T **ppXVar1;
  GenValidUsageXrHandleInfo *pGVar2;
  XrSpace_T **ppXVar3;
  XrAction_T **ppXVar4;
  XrSwapchain_T **ppXVar5;
  XrActionSet_T **ppXVar6;
  XrDebugUtilsMessengerEXT_T **ppXVar7;
  XrSpatialAnchorMSFT_T **ppXVar8;
  XrSpatialGraphNodeBindingMSFT_T **ppXVar9;
  XrHandTrackerEXT_T **ppXVar10;
  XrBodyTrackerFB_T **ppXVar11;
  XrSceneObserverMSFT_T **ppXVar12;
  XrSceneMSFT_T **ppXVar13;
  XrFacialTrackerHTC_T **ppXVar14;
  XrFoveationProfileFB_T **ppXVar15;
  XrTriangleMeshFB_T **ppXVar16;
  XrPassthroughFB_T **ppXVar17;
  XrPassthroughLayerFB_T **ppXVar18;
  XrGeometryInstanceFB_T **ppXVar19;
  XrMarkerDetectorML_T **ppXVar20;
  XrExportedLocalizationMapML_T **ppXVar21;
  XrSpatialAnchorsStorageML_T **ppXVar22;
  XrSpatialAnchorStoreConnectionMSFT_T **ppXVar23;
  XrSpaceUserFB_T **ppXVar24;
  XrFaceTrackerFB_T **ppXVar25;
  XrEyeTrackerFB_T **ppXVar26;
  XrVirtualKeyboardMETA_T **ppXVar27;
  XrPassthroughColorLutMETA_T **ppXVar28;
  XrFaceTracker2FB_T **ppXVar29;
  XrEnvironmentDepthProviderMETA_T **ppXVar30;
  XrEnvironmentDepthSwapchainMETA_T **ppXVar31;
  XrPassthroughHTC_T **ppXVar32;
  XrBodyTrackerHTC_T **ppXVar33;
  XrBodyTrackerBD_T **ppXVar34;
  XrSenseDataProviderBD_T **ppXVar35;
  XrSenseDataSnapshotBD_T **ppXVar36;
  XrAnchorBD_T **ppXVar37;
  XrPlaneDetectorEXT_T **ppXVar38;
  XrWorldMeshDetectorML_T **ppXVar39;
  XrFacialExpressionClientML_T **ppXVar40;
  GenValidUsageXrHandleInfo *handle_info_38;
  GenValidUsageXrHandleInfo *handle_info_37;
  GenValidUsageXrHandleInfo *handle_info_36;
  GenValidUsageXrHandleInfo *handle_info_35;
  GenValidUsageXrHandleInfo *handle_info_34;
  GenValidUsageXrHandleInfo *handle_info_33;
  GenValidUsageXrHandleInfo *handle_info_32;
  GenValidUsageXrHandleInfo *handle_info_31;
  GenValidUsageXrHandleInfo *handle_info_30;
  GenValidUsageXrHandleInfo *handle_info_29;
  GenValidUsageXrHandleInfo *handle_info_28;
  GenValidUsageXrHandleInfo *handle_info_27;
  GenValidUsageXrHandleInfo *handle_info_26;
  GenValidUsageXrHandleInfo *handle_info_25;
  GenValidUsageXrHandleInfo *handle_info_24;
  GenValidUsageXrHandleInfo *handle_info_23;
  GenValidUsageXrHandleInfo *handle_info_22;
  GenValidUsageXrHandleInfo *handle_info_21;
  GenValidUsageXrHandleInfo *handle_info_20;
  GenValidUsageXrHandleInfo *handle_info_19;
  GenValidUsageXrHandleInfo *handle_info_18;
  GenValidUsageXrHandleInfo *handle_info_17;
  GenValidUsageXrHandleInfo *handle_info_16;
  GenValidUsageXrHandleInfo *handle_info_15;
  GenValidUsageXrHandleInfo *handle_info_14;
  GenValidUsageXrHandleInfo *handle_info_13;
  GenValidUsageXrHandleInfo *handle_info_12;
  GenValidUsageXrHandleInfo *handle_info_11;
  GenValidUsageXrHandleInfo *handle_info_10;
  GenValidUsageXrHandleInfo *handle_info_9;
  GenValidUsageXrHandleInfo *handle_info_8;
  GenValidUsageXrHandleInfo *handle_info_7;
  GenValidUsageXrHandleInfo *handle_info_6;
  GenValidUsageXrHandleInfo *handle_info_5;
  GenValidUsageXrHandleInfo *handle_info_4;
  GenValidUsageXrHandleInfo *handle_info_3;
  GenValidUsageXrHandleInfo *handle_info_2;
  GenValidUsageXrHandleInfo *handle_info_1;
  GenValidUsageXrHandleInfo *handle_info;
  uint64_t *outhandle_local;
  XrObjectType *outhandle_type_local;
  uint64_t inhandle_local;
  XrObjectType inhandle_type_local;
  
  if (inhandle_type == XR_OBJECT_TYPE_INSTANCE) {
    inhandle_local._7_1_ = false;
  }
  else {
    outhandle_type_local = (XrObjectType *)inhandle;
    inhandle_local._0_4_ = inhandle_type;
    if (inhandle_type == XR_OBJECT_TYPE_SESSION) {
      ppXVar1 = TreatIntegerAsHandle<XrSession_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_session_info.
                           super_HandleInfoBase<XrSession_T_*,_GenValidUsageXrHandleInfo>,*ppXVar1);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPACE) {
      ppXVar3 = TreatIntegerAsHandle<XrSpace_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpace_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_space_info.super_HandleInfoBase<XrSpace_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar3);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_ACTION) {
      ppXVar4 = TreatIntegerAsHandle<XrAction_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_action_info.
                           super_HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>,*ppXVar4);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SWAPCHAIN) {
      ppXVar5 = TreatIntegerAsHandle<XrSwapchain_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_swapchain_info.
                           super_HandleInfoBase<XrSwapchain_T_*,_GenValidUsageXrHandleInfo>,*ppXVar5
                         );
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_ACTION_SET) {
      ppXVar6 = TreatIntegerAsHandle<XrActionSet_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrActionSet_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_actionset_info.
                           super_HandleInfoBase<XrActionSet_T_*,_GenValidUsageXrHandleInfo>,*ppXVar6
                         );
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
      ppXVar7 = TreatIntegerAsHandle<XrDebugUtilsMessengerEXT_T*>((uint64_t *)&outhandle_type_local)
      ;
      pGVar2 = HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_debugutilsmessengerext_info.
                           super_HandleInfoBase<XrDebugUtilsMessengerEXT_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar7);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_MSFT) {
      ppXVar8 = TreatIntegerAsHandle<XrSpatialAnchorMSFT_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpatialAnchorMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_spatialanchormsft_info.
                           super_HandleInfoBase<XrSpatialAnchorMSFT_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar8);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_GRAPH_NODE_BINDING_MSFT) {
      ppXVar9 = TreatIntegerAsHandle<XrSpatialGraphNodeBindingMSFT_T*>
                          ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpatialGraphNodeBindingMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_spatialgraphnodebindingmsft_info.
                           super_HandleInfoBase<XrSpatialGraphNodeBindingMSFT_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar9);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_HAND_TRACKER_EXT) {
      ppXVar10 = TreatIntegerAsHandle<XrHandTrackerEXT_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_handtrackerext_info.
                           super_HandleInfoBase<XrHandTrackerEXT_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar10);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_FB) {
      ppXVar11 = TreatIntegerAsHandle<XrBodyTrackerFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrBodyTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_bodytrackerfb_info.
                           super_HandleInfoBase<XrBodyTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar11);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT) {
      ppXVar12 = TreatIntegerAsHandle<XrSceneObserverMSFT_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSceneObserverMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_sceneobservermsft_info.
                           super_HandleInfoBase<XrSceneObserverMSFT_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar12);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SCENE_MSFT) {
      ppXVar13 = TreatIntegerAsHandle<XrSceneMSFT_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSceneMSFT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_scenemsft_info.
                           super_HandleInfoBase<XrSceneMSFT_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar13);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FACIAL_TRACKER_HTC) {
      ppXVar14 = TreatIntegerAsHandle<XrFacialTrackerHTC_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrFacialTrackerHTC_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_facialtrackerhtc_info.
                           super_HandleInfoBase<XrFacialTrackerHTC_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar14);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FOVEATION_PROFILE_FB) {
      ppXVar15 = TreatIntegerAsHandle<XrFoveationProfileFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_foveationprofilefb_info.
                           super_HandleInfoBase<XrFoveationProfileFB_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar15);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_TRIANGLE_MESH_FB) {
      ppXVar16 = TreatIntegerAsHandle<XrTriangleMeshFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_trianglemeshfb_info.
                           super_HandleInfoBase<XrTriangleMeshFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar16);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_FB) {
      ppXVar17 = TreatIntegerAsHandle<XrPassthroughFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrPassthroughFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughfb_info.
                           super_HandleInfoBase<XrPassthroughFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar17);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_LAYER_FB) {
      ppXVar18 = TreatIntegerAsHandle<XrPassthroughLayerFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughlayerfb_info.
                           super_HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar18);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_GEOMETRY_INSTANCE_FB) {
      ppXVar19 = TreatIntegerAsHandle<XrGeometryInstanceFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_geometryinstancefb_info.
                           super_HandleInfoBase<XrGeometryInstanceFB_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar19);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_MARKER_DETECTOR_ML) {
      ppXVar20 = TreatIntegerAsHandle<XrMarkerDetectorML_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrMarkerDetectorML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_markerdetectorml_info.
                           super_HandleInfoBase<XrMarkerDetectorML_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar20);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_EXPORTED_LOCALIZATION_MAP_ML) {
      ppXVar21 = TreatIntegerAsHandle<XrExportedLocalizationMapML_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_exportedlocalizationmapml_info.
                           super_HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar21);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML) {
      ppXVar22 = TreatIntegerAsHandle<XrSpatialAnchorsStorageML_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpatialAnchorsStorageML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_spatialanchorsstorageml_info.
                           super_HandleInfoBase<XrSpatialAnchorsStorageML_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar22);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_STORE_CONNECTION_MSFT) {
      ppXVar23 = TreatIntegerAsHandle<XrSpatialAnchorStoreConnectionMSFT_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>::
               get(&g_spatialanchorstoreconnectionmsft_info.
                    super_HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>
                   ,*ppXVar23);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SPACE_USER_FB) {
      ppXVar24 = TreatIntegerAsHandle<XrSpaceUserFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_spaceuserfb_info.
                           super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar24);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER_FB) {
      ppXVar25 = TreatIntegerAsHandle<XrFaceTrackerFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrFaceTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_facetrackerfb_info.
                           super_HandleInfoBase<XrFaceTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar25);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_EYE_TRACKER_FB) {
      ppXVar26 = TreatIntegerAsHandle<XrEyeTrackerFB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_eyetrackerfb_info.
                           super_HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar26);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_VIRTUAL_KEYBOARD_META) {
      ppXVar27 = TreatIntegerAsHandle<XrVirtualKeyboardMETA_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrVirtualKeyboardMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_virtualkeyboardmeta_info.
                           super_HandleInfoBase<XrVirtualKeyboardMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar27);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_COLOR_LUT_META) {
      ppXVar28 = TreatIntegerAsHandle<XrPassthroughColorLutMETA_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughcolorlutmeta_info.
                           super_HandleInfoBase<XrPassthroughColorLutMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar28);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER2_FB) {
      ppXVar29 = TreatIntegerAsHandle<XrFaceTracker2FB_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrFaceTracker2FB_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_facetracker2fb_info.
                           super_HandleInfoBase<XrFaceTracker2FB_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar29);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_PROVIDER_META) {
      ppXVar30 = TreatIntegerAsHandle<XrEnvironmentDepthProviderMETA_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrEnvironmentDepthProviderMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_environmentdepthprovidermeta_info.
                           super_HandleInfoBase<XrEnvironmentDepthProviderMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar30);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META) {
      ppXVar31 = TreatIntegerAsHandle<XrEnvironmentDepthSwapchainMETA_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_environmentdepthswapchainmeta_info.
                           super_HandleInfoBase<XrEnvironmentDepthSwapchainMETA_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar31);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_HTC) {
      ppXVar32 = TreatIntegerAsHandle<XrPassthroughHTC_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrPassthroughHTC_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_passthroughhtc_info.
                           super_HandleInfoBase<XrPassthroughHTC_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar32);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_HTC) {
      ppXVar33 = TreatIntegerAsHandle<XrBodyTrackerHTC_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_bodytrackerhtc_info.
                           super_HandleInfoBase<XrBodyTrackerHTC_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar33);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_BD) {
      ppXVar34 = TreatIntegerAsHandle<XrBodyTrackerBD_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrBodyTrackerBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_bodytrackerbd_info.
                           super_HandleInfoBase<XrBodyTrackerBD_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar34);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD) {
      ppXVar35 = TreatIntegerAsHandle<XrSenseDataProviderBD_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSenseDataProviderBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_sensedataproviderbd_info.
                           super_HandleInfoBase<XrSenseDataProviderBD_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar35);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD) {
      ppXVar36 = TreatIntegerAsHandle<XrSenseDataSnapshotBD_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrSenseDataSnapshotBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_sensedatasnapshotbd_info.
                           super_HandleInfoBase<XrSenseDataSnapshotBD_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar36);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_ANCHOR_BD) {
      ppXVar37 = TreatIntegerAsHandle<XrAnchorBD_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_anchorbd_info.
                           super_HandleInfoBase<XrAnchorBD_T_*,_GenValidUsageXrHandleInfo>,*ppXVar37
                         );
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_PLANE_DETECTOR_EXT) {
      ppXVar38 = TreatIntegerAsHandle<XrPlaneDetectorEXT_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_planedetectorext_info.
                           super_HandleInfoBase<XrPlaneDetectorEXT_T_*,_GenValidUsageXrHandleInfo>,
                          *ppXVar38);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_WORLD_MESH_DETECTOR_ML) {
      ppXVar39 = TreatIntegerAsHandle<XrWorldMeshDetectorML_T*>((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_worldmeshdetectorml_info.
                           super_HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar39);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else if (inhandle_type == XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML) {
      ppXVar40 = TreatIntegerAsHandle<XrFacialExpressionClientML_T*>
                           ((uint64_t *)&outhandle_type_local);
      pGVar2 = HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>::get
                         (&g_facialexpressionclientml_info.
                           super_HandleInfoBase<XrFacialExpressionClientML_T_*,_GenValidUsageXrHandleInfo>
                          ,*ppXVar40);
      *outhandle_type = pGVar2->direct_parent_type;
      *outhandle = pGVar2->direct_parent_handle;
      inhandle_local._7_1_ = true;
    }
    else {
      inhandle_local._7_1_ = false;
    }
  }
  return inhandle_local._7_1_;
}

Assistant:

bool GetXrParent(const XrObjectType inhandle_type, const uint64_t inhandle,
                 XrObjectType& outhandle_type, uint64_t& outhandle) {
    if (inhandle_type == XR_OBJECT_TYPE_INSTANCE) {
        return false;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SESSION) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_session_info.get(TreatIntegerAsHandle<XrSession>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPACE) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_space_info.get(TreatIntegerAsHandle<XrSpace>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ACTION) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_action_info.get(TreatIntegerAsHandle<XrAction>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SWAPCHAIN) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_swapchain_info.get(TreatIntegerAsHandle<XrSwapchain>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ACTION_SET) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_actionset_info.get(TreatIntegerAsHandle<XrActionSet>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_DEBUG_UTILS_MESSENGER_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_debugutilsmessengerext_info.get(TreatIntegerAsHandle<XrDebugUtilsMessengerEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchormsft_info.get(TreatIntegerAsHandle<XrSpatialAnchorMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_GRAPH_NODE_BINDING_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialgraphnodebindingmsft_info.get(TreatIntegerAsHandle<XrSpatialGraphNodeBindingMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_HAND_TRACKER_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_handtrackerext_info.get(TreatIntegerAsHandle<XrHandTrackerEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerfb_info.get(TreatIntegerAsHandle<XrBodyTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SCENE_OBSERVER_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sceneobservermsft_info.get(TreatIntegerAsHandle<XrSceneObserverMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SCENE_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_scenemsft_info.get(TreatIntegerAsHandle<XrSceneMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACIAL_TRACKER_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facialtrackerhtc_info.get(TreatIntegerAsHandle<XrFacialTrackerHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FOVEATION_PROFILE_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_foveationprofilefb_info.get(TreatIntegerAsHandle<XrFoveationProfileFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_TRIANGLE_MESH_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_trianglemeshfb_info.get(TreatIntegerAsHandle<XrTriangleMeshFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughfb_info.get(TreatIntegerAsHandle<XrPassthroughFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_LAYER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughlayerfb_info.get(TreatIntegerAsHandle<XrPassthroughLayerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_GEOMETRY_INSTANCE_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_geometryinstancefb_info.get(TreatIntegerAsHandle<XrGeometryInstanceFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_MARKER_DETECTOR_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_markerdetectorml_info.get(TreatIntegerAsHandle<XrMarkerDetectorML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_EXPORTED_LOCALIZATION_MAP_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_exportedlocalizationmapml_info.get(TreatIntegerAsHandle<XrExportedLocalizationMapML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchorsstorageml_info.get(TreatIntegerAsHandle<XrSpatialAnchorsStorageML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPATIAL_ANCHOR_STORE_CONNECTION_MSFT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spatialanchorstoreconnectionmsft_info.get(TreatIntegerAsHandle<XrSpatialAnchorStoreConnectionMSFT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SPACE_USER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_spaceuserfb_info.get(TreatIntegerAsHandle<XrSpaceUserFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facetrackerfb_info.get(TreatIntegerAsHandle<XrFaceTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_EYE_TRACKER_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_eyetrackerfb_info.get(TreatIntegerAsHandle<XrEyeTrackerFB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_VIRTUAL_KEYBOARD_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_virtualkeyboardmeta_info.get(TreatIntegerAsHandle<XrVirtualKeyboardMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_COLOR_LUT_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughcolorlutmeta_info.get(TreatIntegerAsHandle<XrPassthroughColorLutMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACE_TRACKER2_FB) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facetracker2fb_info.get(TreatIntegerAsHandle<XrFaceTracker2FB>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_PROVIDER_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_environmentdepthprovidermeta_info.get(TreatIntegerAsHandle<XrEnvironmentDepthProviderMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_environmentdepthswapchainmeta_info.get(TreatIntegerAsHandle<XrEnvironmentDepthSwapchainMETA>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PASSTHROUGH_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_passthroughhtc_info.get(TreatIntegerAsHandle<XrPassthroughHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_HTC) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerhtc_info.get(TreatIntegerAsHandle<XrBodyTrackerHTC>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_BODY_TRACKER_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_bodytrackerbd_info.get(TreatIntegerAsHandle<XrBodyTrackerBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_PROVIDER_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sensedataproviderbd_info.get(TreatIntegerAsHandle<XrSenseDataProviderBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_sensedatasnapshotbd_info.get(TreatIntegerAsHandle<XrSenseDataSnapshotBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_ANCHOR_BD) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_anchorbd_info.get(TreatIntegerAsHandle<XrAnchorBD>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_PLANE_DETECTOR_EXT) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_planedetectorext_info.get(TreatIntegerAsHandle<XrPlaneDetectorEXT>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_WORLD_MESH_DETECTOR_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_worldmeshdetectorml_info.get(TreatIntegerAsHandle<XrWorldMeshDetectorML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    if (inhandle_type == XR_OBJECT_TYPE_FACIAL_EXPRESSION_CLIENT_ML) {
        // Get the object and parent of the handle
        GenValidUsageXrHandleInfo *handle_info = g_facialexpressionclientml_info.get(TreatIntegerAsHandle<XrFacialExpressionClientML>(inhandle));
        outhandle_type = handle_info->direct_parent_type;
        outhandle = handle_info->direct_parent_handle;
        return true;
    }
    return false;
}